

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

Vec_Ptr_t * Abc_CutFactor(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vLeaves;
  void *pvVar3;
  int i;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar2 != 5) && (uVar2 != 2)) {
    vLeaves = Vec_PtrAlloc(10);
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves);
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vLeaves);
    iVar1 = vLeaves->nSize;
    for (i = 0; i < iVar1; i = i + 1) {
      pvVar3 = Vec_PtrEntry(vLeaves,i);
      *(byte *)((long)pvVar3 + 0x14) = *(byte *)((long)pvVar3 + 0x14) & 0xef;
    }
    return vLeaves;
  }
  __assert_fail("!Abc_ObjIsCi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x819,"Vec_Ptr_t *Abc_CutFactor(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_CutFactor( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_ObjIsCi(pNode) );
    vLeaves  = Vec_PtrAlloc( 10 );
    Abc_CutFactor_rec( Abc_ObjFanin0(pNode), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pNode), vLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkA = 0;
    return vLeaves;
}